

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

Namespace * __thiscall flatbuffers::Parser::UniqueNamespace(Parser *this,Namespace *ns)

{
  pointer *pppNVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  bool bVar2;
  Namespace **__args;
  iterator __position;
  Namespace *local_20;
  
  local_20 = ns;
  __args = (this->namespaces_).
           super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->namespaces_).
       super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (__args == __position._M_current) {
      if (__position._M_current ==
          (this->namespaces_).
          super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        __args = &local_20;
        std::vector<flatbuffers::Namespace*,std::allocator<flatbuffers::Namespace*>>::
        _M_realloc_insert<flatbuffers::Namespace*const&>
                  ((vector<flatbuffers::Namespace*,std::allocator<flatbuffers::Namespace*>> *)
                   &this->namespaces_,__position,__args);
      }
      else {
        *__position._M_current = ns;
        pppNVar1 = &(this->namespaces_).
                    super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppNVar1 = *pppNVar1 + 1;
        __args = &local_20;
      }
LAB_0011af7e:
      return *__args;
    }
    __first1 = (ns->components).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    __last1 = (ns->components).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __first2 = ((*__args)->components).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((long)__last1 - (long)__first1 ==
        (long)((*__args)->components).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)__first2) {
      bVar2 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                        (__first1,__last1,__first2);
      if (bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&ns->components);
        operator_delete(ns,0x20);
        goto LAB_0011af7e;
      }
      __position._M_current =
           (this->namespaces_).
           super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
    }
    __args = __args + 1;
  } while( true );
}

Assistant:

Namespace *Parser::UniqueNamespace(Namespace *ns) {
  for (auto it = namespaces_.begin(); it != namespaces_.end(); ++it) {
    if (ns->components == (*it)->components) {
      delete ns;
      return *it;
    }
  }
  namespaces_.push_back(ns);
  return ns;
}